

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_string.cpp
# Opt level: O0

ON_aStringHeader * __thiscall ON_String::Header(ON_String *this)

{
  ON_Internal_Empty_aString *local_18;
  ON_aStringHeader *hdr;
  ON_String *this_local;
  
  if (this->m_s == (char *)0x0) {
    local_18 = &empty_astring;
  }
  else {
    local_18 = (ON_Internal_Empty_aString *)(this->m_s + -0xc);
  }
  return &local_18->header;
}

Assistant:

ON_aStringHeader* ON_String::Header() const
{
  ON_aStringHeader* hdr = (ON_aStringHeader*)m_s;
  if (hdr)
    hdr--;
  else
    hdr = &empty_astring.header;
  return hdr;
}